

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O1

TOKEN __thiscall CNetTokenCache::GetToken(CNetTokenCache *this,NETADDR *pAddr)

{
  int iVar1;
  NETADDR *a;
  
  a = (NETADDR *)CRingBufferBase::Last((CRingBufferBase *)this);
  while( true ) {
    if (a == (NETADDR *)0x0) {
      return 0xffffffff;
    }
    iVar1 = net_addr_comp(a,pAddr,1);
    if (iVar1 == 0) break;
    a = (NETADDR *)CRingBufferBase::Prev((CRingBufferBase *)this,a);
  }
  return a[1].type;
}

Assistant:

TOKEN CNetTokenCache::GetToken(const NETADDR *pAddr)
{
	// traverse the list in the reverse direction
	// newest caches are the best
	CAddressInfo *pInfo = m_TokenCache.Last();
	while(pInfo)
	{
		if(net_addr_comp(&pInfo->m_Addr, pAddr, true) == 0)
			return pInfo->m_Token;
		pInfo = m_TokenCache.Prev(pInfo);
	}
	return NET_TOKEN_NONE;
}